

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin2cpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  string arg_x;
  string filename;
  string filen;
  fstream file;
  fstream outfile;
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg_x,argv[3],(allocator<char> *)&file);
    bVar1 = std::operator!=(&arg_x,"c");
    if ((((!bVar1) || (bVar1 = std::operator!=(&arg_x,"cpp"), !bVar1)) ||
        (bVar1 = std::operator!=(&arg_x,"cpp17"), !bVar1)) ||
       (bVar1 = std::operator!=(&arg_x,"go"), !bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file,argv[1],(allocator<char> *)&outfile);
      convertFilename(&filen,(string *)&file);
      std::__cxx11::string::~string((string *)&file);
      std::fstream::fstream(&file);
      std::fstream::open((char *)&file,(_Ios_Openmode)argv[1]);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error opening file: ");
        poVar3 = std::operator<<(poVar3,argv[1]);
        std::operator<<(poVar3,"\n");
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filename,argv[2],(allocator<char> *)&outfile);
        bVar1 = std::operator==(&arg_x,"c");
        if (((bVar1) || (bVar1 = std::operator==(&arg_x,"cpp"), bVar1)) ||
           ((bVar1 = std::operator==(&arg_x,"cpp17"), bVar1 ||
            (bVar1 = std::operator==(&arg_x,"go"), bVar1)))) {
          std::__cxx11::string::append((char *)&filename);
        }
        std::fstream::fstream(&outfile);
        std::fstream::open((string *)&outfile,(_Ios_Openmode)&filename);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open file: ");
          poVar3 = std::operator<<(poVar3,(string *)&filename);
          std::operator<<(poVar3,"\n");
          std::fstream::close();
        }
        else {
          bVar1 = std::operator==(&arg_x,"cpp17");
          if (bVar1) {
            outputCpp17(&filename,&file,&filen,&outfile);
          }
          else {
            bVar1 = std::operator==(&arg_x,"c");
            if ((bVar1) || (bVar1 = std::operator==(&arg_x,"cpp"), bVar1)) {
              outputCpp(&filename,&file,&filen,&outfile,&arg_x,argv);
            }
            else {
              bVar1 = std::operator==(&arg_x,"go");
              if (bVar1) {
                outputGo(&filename,&file,&filen,&outfile);
              }
            }
          }
        }
        std::fstream::~fstream(&outfile);
        std::__cxx11::string::~string((string *)&filename);
      }
      std::fstream::~fstream(&file);
      std::__cxx11::string::~string((string *)&filen);
      std::__cxx11::string::~string((string *)&arg_x);
      return 0;
    }
    std::operator<<((ostream *)&std::cerr,
                    "Invalid language selection please use either c or cpp or cpp17 or go\n");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error requires two arguments.\n");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," binarysource outputfile lang\nlang is either c or cpp\n");
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    if(argc != 4) {
        std::cerr << "Error requires two arguments.\n" << argv[0] << " binarysource outputfile lang\nlang is either c or cpp\n";
        exit(EXIT_FAILURE);
    }
    std::string arg_x = argv[3];
    if(arg_x != "c" && arg_x != "cpp" && arg_x != "cpp17" && arg_x != "go") {
        std::cerr << "Invalid language selection please use either c or cpp or cpp17 or go\n";
        exit(EXIT_FAILURE);
    }
    std::string filen = convertFilename(argv[1]);
    std::fstream file;
    file.open(argv[1], std::ios::in | std::ios::binary);
    if(!file.is_open()) {
        std::cerr << "Error opening file: " << argv[1] << "\n";
        return 0;
    }
    std::string filename=argv[2];
    if(arg_x == "c" || arg_x == "cpp")
    	filename += ".h";
    else if(arg_x == "cpp17")
        filename += ".hpp";
    else if(arg_x == "go")
        filename += ".go";
    
    std::fstream outfile;
    outfile.open(filename, std::ios::out);
    if(!outfile.is_open()) {
        std::cerr << "Could not open file: " << filename << "\n";
        file.close();
        return 0;
    }
    
    if(arg_x == "cpp17") {
        outputCpp17(filename, file, filen, outfile);
    }
    else if(arg_x == "c" || arg_x == "cpp") {
        outputCpp(filename, file, filen, outfile, arg_x, argv);
    }
    else if(arg_x == "go") {
        outputGo(filename, file, filen, outfile);
    }
    return 0;
}